

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

void ggml_backend_cpu_set_threadpool(ggml_backend_t backend_cpu,ggml_threadpool_t threadpool)

{
  long lVar1;
  _Bool _Var2;
  ggml_backend_t in_RSI;
  long in_RDI;
  ggml_backend_cpu_context *ctx;
  
  _Var2 = ggml_backend_is_cpu(in_RSI);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.cpp"
               ,0xeb,"GGML_ASSERT(%s) failed","ggml_backend_is_cpu(backend_cpu)");
  }
  lVar1 = *(long *)(in_RDI + 0x78);
  if ((*(long *)(lVar1 + 8) != 0) && (*(ggml_backend_t *)(lVar1 + 8) != in_RSI)) {
    ggml_threadpool_pause((ggml_threadpool *)0x119111);
  }
  *(ggml_backend_t *)(lVar1 + 8) = in_RSI;
  return;
}

Assistant:

void ggml_backend_cpu_set_threadpool(ggml_backend_t backend_cpu, ggml_threadpool_t threadpool) {
    GGML_ASSERT(ggml_backend_is_cpu(backend_cpu));

    struct ggml_backend_cpu_context * ctx = (struct ggml_backend_cpu_context *)backend_cpu->context;

    if (ctx->threadpool && ctx->threadpool != threadpool) {
        // already had a different threadpool, pause/suspend it before switching
        ggml_threadpool_pause(ctx->threadpool);
    }
    ctx->threadpool = threadpool;
}